

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O0

size_t ver_get_last_wal_flush_hdr_off(filemgr_magic_t magic)

{
  filemgr_magic_t magic_local;
  undefined8 local_8;
  
  if (magic == 0xdeadcafebeefbeef) {
    local_8 = 0x28;
  }
  else if (magic == 0xdeadcafebeefc001) {
    local_8 = 0x30;
  }
  else if (magic == 0xdeadcafebeefc002) {
    local_8 = 0x38;
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t ver_get_last_wal_flush_hdr_off(filemgr_magic_t magic) {
    switch(magic) {
        case FILEMGR_MAGIC_000: return 40;
        case FILEMGR_MAGIC_001: return 48;
        case FILEMGR_MAGIC_002: return 56;
    }
    return (size_t) -1;
}